

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O2

void __thiscall
ymfm::fm_engine_base<ymfm::opn_registers_base<true>_>::engine_mode_write
          (fm_engine_base<ymfm::opn_registers_base<true>_> *this,uint8_t data)

{
  this->m_modified_channels = 0x3f;
  (this->m_regs).m_regdata[0x27] = data;
  set_reset_status(this,'\0',data >> 4 & 3);
  update_timer(this,1,*(uint *)((this->m_regs).m_regdata + 0x27) >> 1 & 1,
               -(this->m_total_clocks & 0xf));
  update_timer(this,0,(this->m_regs).m_regdata[0x27] & 1,0);
  return;
}

Assistant:

void fm_engine_base<RegisterType>::engine_mode_write(uint8_t data)
{
	// mark all channels as modified
	m_modified_channels = ALL_CHANNELS;

	// actually write the mode register now
	uint32_t dummy1, dummy2;
	m_regs.write(RegisterType::REG_MODE, data, dummy1, dummy2);

	// reset IRQ status -- when written, all other bits are ignored
	// QUESTION: should this maybe just reset the IRQ bit and not all the bits?
	//   That is, check_interrupts would only set, this would only clear?
	if (m_regs.irq_reset())
		set_reset_status(0, 0x78);
	else
	{
		// reset timer status
		uint8_t reset_mask = 0;
		if (m_regs.reset_timer_b())
			reset_mask |= RegisterType::STATUS_TIMERB;
		if (m_regs.reset_timer_a())
			reset_mask |= RegisterType::STATUS_TIMERA;
		set_reset_status(0, reset_mask);

		// load timers; note that timer B gets a small negative adjustment because
		// the *16 multiplier is free-running, so the first tick of the clock
		// is a bit shorter
		update_timer(1, m_regs.load_timer_b(), -(m_total_clocks & 15));
		update_timer(0, m_regs.load_timer_a(), 0);
	}
}